

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::adjust_pressure(Renderer *this,int chan,int note,int amount)

{
  long lVar1;
  Voice *pVVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = (long)this->voices;
  if (lVar1 != 0) {
    pVVar2 = this->voice;
    do {
      lVar3 = 1 - lVar1;
      lVar4 = lVar1 * 0x170;
      while (((((&pVVar2[-1].status)[lVar4] & 1) == 0 ||
              ((uint)(&pVVar2[-1].channel)[lVar4] != chan)) ||
             ((uint)(&pVVar2[-1].note)[lVar4] != note))) {
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + -0x170;
        if (lVar3 == 1) {
          return;
        }
      }
      (&pVVar2[-1].velocity)[lVar4] = (BYTE)amount;
      recompute_amp(this,(Voice *)(&pVVar2[-1].status + lVar4));
      apply_envelope_to_amp((Voice *)(&this->voice[-1].status + lVar4));
      if (lVar3 == 0) {
        return;
      }
      pVVar2 = this->voice;
      lVar1 = -lVar3;
    } while (*(char *)(*(long *)((long)&pVVar2[-1].sample + lVar4) + 0x50) != '\0');
  }
  return;
}

Assistant:

void Renderer::adjust_pressure(int chan, int note, int amount)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) &&
			voice[i].channel == chan &&
			voice[i].note == note)
		{
			voice[i].velocity = amount;
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
			if (!(voice[i].sample->self_nonexclusive))
			{
				return;
			}
		}
	}
}